

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

size_t cmsys::SystemTools::CountChar(char *str,char c)

{
  size_t local_20;
  size_t count;
  char *pcStack_10;
  char c_local;
  char *str_local;
  
  local_20 = 0;
  pcStack_10 = str;
  if (str != (char *)0x0) {
    for (; *pcStack_10 != '\0'; pcStack_10 = pcStack_10 + 1) {
      if (*pcStack_10 == c) {
        local_20 = local_20 + 1;
      }
    }
  }
  return local_20;
}

Assistant:

size_t SystemTools::CountChar(const char* str, char c)
{
  size_t count = 0;

  if (str)
    {
    while (*str)
      {
      if (*str == c)
        {
        ++count;
        }
      ++str;
      }
    }
  return count;
}